

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_SameFourSequences_Test::
~TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_SameFourSequences_Test
          (TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_SameFourSequences_Test *this)

{
  TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_SameFourSequences_Test *this_local;
  
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::
  ~TEST_GROUP_CppUTestGroupDoublingFactorCounterTest
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, TwoSetsOfIdenticalSequences_SameFourSequences)
{
	addPair(Tile::SouthWind);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfCircles, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::TwoSetsOfIdenticalSequences));
}